

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O1

void Abc_SuppReadMinTest(char *pFileName)

{
  int iVar1;
  uint uVar2;
  Vec_Wrd_t *vCubes;
  Vec_Wrd_t *p;
  long lVar3;
  int level;
  long lVar4;
  int nVars;
  timespec ts;
  int local_2c;
  timespec local_28;
  
  clock_gettime(3,&local_28);
  vCubes = Abc_SuppReadMin(pFileName,&local_2c);
  if (vCubes != (Vec_Wrd_t *)0x0) {
    p = Abc_SuppDiffMatrix(vCubes);
    if (vCubes->pArray != (word *)0x0) {
      free(vCubes->pArray);
      vCubes->pArray = (word *)0x0;
    }
    free(vCubes);
    iVar1 = clock_gettime(3,&local_28);
    if (iVar1 < 0) {
      lVar3 = 1;
    }
    else {
      lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_28.tv_nsec),8);
      lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_28.tv_sec * -1000000;
    }
    uVar2 = Abc_SuppSolve(p,local_2c);
    printf("Solution with %d variables found.  ",(ulong)uVar2);
    level = 3;
    iVar1 = clock_gettime(3,&local_28);
    if (iVar1 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
    }
    Abc_Print(level,"%s =","Covering time");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
    if (p != (Vec_Wrd_t *)0x0) {
      if (p->pArray != (word *)0x0) {
        free(p->pArray);
        p->pArray = (word *)0x0;
      }
      free(p);
    }
  }
  return;
}

Assistant:

void Abc_SuppReadMinTest( char * pFileName )
{
//    int fVerbose = 0;
    abctime clk = Abc_Clock();
//    word Matrix[64];
    int nVars, nVarsMin;
    Vec_Wrd_t * vPairs, * vCubes;
    vCubes = Abc_SuppReadMin( pFileName, &nVars );
    if ( vCubes == NULL )
        return;
    vPairs = Abc_SuppDiffMatrix( vCubes );
    Vec_WrdFreeP( &vCubes );
    // solve the problem
    clk = Abc_Clock();
//    nVarsMin = Abc_SuppMinimize( Matrix, vPairs, nVars, fVerbose );
    nVarsMin = Abc_SuppSolve( vPairs, nVars );
    printf( "Solution with %d variables found.  ", nVarsMin );
    Abc_PrintTime( 1, "Covering time", Abc_Clock() - clk );

    Vec_WrdFreeP( &vPairs );
}